

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O1

void test_qclab_dense_kron<std::complex<double>>(void)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double *__s;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  pointer *__ptr_3;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  double *in_R9;
  long lVar9;
  long lVar10;
  internal iVar11;
  bool bVar12;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  SquareMatrix<std::complex<double>_> A;
  SquareMatrix<std::complex<double>_> B;
  SquareMatrix<std::complex<double>_> BoA;
  SquareMatrix<std::complex<double>_> AoB;
  SquareMatrix<std::complex<double>_> XoI;
  AssertionResult gtest_ar__3;
  SquareMatrix<std::complex<double>_> IoX;
  SquareMatrix<std::complex<double>_> X;
  SquareMatrix<std::complex<double>_> I;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_e0;
  SquareMatrix<std::complex<double>_> local_d8;
  string local_c8;
  internal local_a8;
  undefined7 uStack_a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  double *local_90;
  internal local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  Message local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  AssertHelper local_68;
  long local_60;
  double *local_58;
  SquareMatrix<std::complex<double>_> local_50;
  SquareMatrix<std::complex<double>_> local_40;
  
  local_40.size_ = 2;
  local_40.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )operator_new__(0x40);
  *(undefined8 *)
   local_40.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   local_40.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_40.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  local_50.size_ = 2;
  local_50.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )operator_new__(0x40);
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   local_50.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   local_50.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  qclab::dense::kron<std::complex<double>>((dense *)&local_60,&local_40,&local_50);
  __s = (double *)operator_new__(0x100);
  memset(__s,0,0x100);
  __s[2] = 1.0;
  __s[3] = 0.0;
  __s[4] = 0.0;
  __s[5] = 0.0;
  __s[6] = 0.0;
  __s[7] = 0.0;
  __s[8] = 1.0;
  __s[9] = 0.0;
  __s[10] = 0.0;
  __s[0xb] = 0.0;
  __s[0xc] = 0.0;
  __s[0xd] = 0.0;
  __s[0xe] = 0.0;
  __s[0xf] = 0.0;
  __s[0x10] = 0.0;
  __s[0x11] = 0.0;
  __s[0x12] = 0.0;
  __s[0x13] = 0.0;
  __s[0x14] = 0.0;
  __s[0x15] = 0.0;
  __s[0x16] = 1.0;
  __s[0x17] = 0.0;
  __s[0x18] = 0.0;
  __s[0x19] = 0.0;
  __s[0x1a] = 0.0;
  __s[0x1b] = 0.0;
  __s[0x1c] = 1.0;
  __s[0x1f] = 0.0;
  __s[0x1d] = 0.0;
  __s[0x1e] = 0.0;
  local_88 = (internal)0x0;
  if (local_60 == 4) {
    local_88 = (internal)0x0;
    if ((((*__s == *local_58) && (!NAN(*__s) && !NAN(*local_58))) &&
        (local_88 = (internal)0x0, __s[1] == local_58[1])) && (!NAN(__s[1]) && !NAN(local_58[1]))) {
      lVar7 = 0;
      local_88 = (internal)0x0;
      pdVar4 = local_58;
      in_R9 = __s;
      do {
        lVar9 = 0x18;
        lVar10 = 0;
        while( true ) {
          if (lVar10 == 3) goto LAB_00199b7c;
          dVar3 = *(double *)((long)in_R9 + lVar9 + -8);
          lVar10 = lVar10 + 1;
          pdVar5 = (double *)((long)pdVar4 + lVar9 + -8);
          if ((dVar3 != *pdVar5) || (NAN(dVar3) || NAN(*pdVar5))) break;
          pdVar5 = (double *)((long)in_R9 + lVar9);
          pdVar6 = (double *)((long)pdVar4 + lVar9);
          lVar9 = lVar9 + 0x10;
          if ((*pdVar5 != *pdVar6) || (NAN(*pdVar5) || NAN(*pdVar6))) break;
        }
        if (lVar10 < 4) break;
LAB_00199b7c:
        lVar7 = lVar7 + 1;
        local_88 = (internal)(3 < lVar7);
        if (lVar7 == 4) break;
        if ((__s[lVar7 * 8] != local_58[lVar7 * 8]) ||
           (NAN(__s[lVar7 * 8]) || NAN(local_58[lVar7 * 8]))) break;
        in_R9 = in_R9 + 8;
        pdVar4 = pdVar4 + 8;
        if ((__s[lVar7 * 8 + 1] != local_58[lVar7 * 8 + 1]) ||
           (NAN(__s[lVar7 * 8 + 1]) || NAN(local_58[lVar7 * 8 + 1]))) break;
      } while( true );
    }
  }
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_88) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_88,(AssertionResult *)"IoX == IoX_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  qclab::dense::kron<std::complex<double>>((dense *)&local_88,&local_50,&local_40);
  pdVar4 = (double *)operator_new__(0x100);
  memset(pdVar4,0,0x100);
  pdVar4[4] = 1.0;
  pdVar4[5] = 0.0;
  pdVar4[6] = 0.0;
  pdVar4[7] = 0.0;
  pdVar4[8] = 0.0;
  pdVar4[9] = 0.0;
  pdVar4[10] = 0.0;
  pdVar4[0xb] = 0.0;
  pdVar4[0xc] = 0.0;
  pdVar4[0xd] = 0.0;
  pdVar4[0xe] = 1.0;
  pdVar4[0xf] = 0.0;
  pdVar4[0x10] = 1.0;
  pdVar4[0x11] = 0.0;
  pdVar4[0x12] = 0.0;
  pdVar4[0x13] = 0.0;
  pdVar4[0x14] = 0.0;
  pdVar4[0x15] = 0.0;
  pdVar4[0x16] = 0.0;
  pdVar4[0x17] = 0.0;
  pdVar4[0x18] = 0.0;
  pdVar4[0x19] = 0.0;
  pdVar4[0x1a] = 1.0;
  pdVar4[0x1b] = 0.0;
  pdVar4[0x1c] = 0.0;
  pdVar4[0x1d] = 0.0;
  pdVar4[0x1e] = 0.0;
  pdVar4[0x1f] = 0.0;
  bVar12 = false;
  if (CONCAT71(uStack_87,local_88) == 4) {
    bVar12 = false;
    if ((((*pdVar4 == (double)(local_80->_M_dataplus)._M_p) &&
         (!NAN(*pdVar4) && !NAN((double)(local_80->_M_dataplus)._M_p))) &&
        (bVar12 = false, pdVar4[1] == (double)local_80->_M_string_length)) &&
       (!NAN(pdVar4[1]) && !NAN((double)local_80->_M_string_length))) {
      lVar7 = 0;
      bVar12 = false;
      pbVar8 = local_80;
      in_R9 = pdVar4;
      do {
        lVar9 = 0x18;
        lVar10 = 0;
        while( true ) {
          if (lVar10 == 3) goto LAB_00199dd1;
          dVar3 = *(double *)((long)in_R9 + lVar9 + -8);
          lVar10 = lVar10 + 1;
          pdVar5 = (double *)((long)pbVar8 + lVar9 + -8);
          if ((dVar3 != *pdVar5) || (NAN(dVar3) || NAN(*pdVar5))) break;
          pdVar5 = (double *)((long)in_R9 + lVar9);
          pdVar6 = (double *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9);
          lVar9 = lVar9 + 0x10;
          if ((*pdVar5 != *pdVar6) || (NAN(*pdVar5) || NAN(*pdVar6))) break;
        }
        if (lVar10 < 4) break;
LAB_00199dd1:
        lVar7 = lVar7 + 1;
        bVar12 = 3 < lVar7;
        if (lVar7 == 4) break;
        if ((pdVar4[lVar7 * 8] != (double)local_80[lVar7 * 2]._M_dataplus._M_p) ||
           (NAN(pdVar4[lVar7 * 8]) || NAN((double)local_80[lVar7 * 2]._M_dataplus._M_p))) break;
        in_R9 = in_R9 + 8;
        pbVar8 = pbVar8 + 2;
        if ((pdVar4[lVar7 * 8 + 1] != (double)local_80[lVar7 * 2]._M_string_length) ||
           (NAN(pdVar4[lVar7 * 8 + 1]) || NAN((double)local_80[lVar7 * 2]._M_string_length))) break;
      } while( true );
    }
  }
  local_e8[0] = bVar12;
  local_e0._M_head_impl = (complex<double> *)0x0;
  if (!bVar12) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_e8,(AssertionResult *)"XoI == XoI_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_d8.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_d8.size_ + 8))();
    }
  }
  if (local_e0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl);
  }
  local_e8 = (undefined1  [8])0x2;
  local_e0._M_head_impl = (complex<double> *)operator_new__(0x40);
  *(undefined8 *)((long)local_e0._M_head_impl + 0x30) = 0;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x38) = 0;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x20) = 0;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x28) = 0;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x10) = 0;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x18) = 0;
  *(undefined8 *)local_e0._M_head_impl = 0;
  *(undefined8 *)((long)local_e0._M_head_impl + 8) = 0;
  *(undefined8 *)local_e0._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)((long)local_e0._M_head_impl + 8) = 0;
  *(undefined1 **)((long)local_e0._M_head_impl + 0x10) = &DAT_4008000000000000;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x18) = 0;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x20) = 0x4000000000000000;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x28) = 0;
  *(undefined1 **)((long)local_e0._M_head_impl + 0x30) = &DAT_4014000000000000;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x38) = 0;
  local_d8.size_ = 2;
  local_d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )operator_new__(0x40);
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   local_d8.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined1 **)
   local_d8.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = &DAT_401c000000000000;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined1 **)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) =
       &DAT_402a000000000000;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined1 **)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) =
       &DAT_4026000000000000;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) =
       0x4031000000000000;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_98,(SquareMatrix<std::complex<double>_> *)local_e8,&local_d8);
  pdVar5 = (double *)operator_new__(0x100);
  iVar11 = (internal)0x0;
  memset(pdVar5,0,0x100);
  *pdVar5 = (double)&DAT_401c000000000000;
  pdVar5[1] = 0.0;
  pdVar5[2] = (double)&DAT_402a000000000000;
  pdVar5[3] = 0.0;
  pdVar5[4] = 21.0;
  pdVar5[5] = 0.0;
  pdVar5[6] = 39.0;
  pdVar5[7] = 0.0;
  pdVar5[8] = (double)&DAT_4026000000000000;
  pdVar5[9] = 0.0;
  pdVar5[10] = 17.0;
  pdVar5[0xb] = 0.0;
  pdVar5[0xc] = 33.0;
  pdVar5[0xd] = 0.0;
  pdVar5[0xe] = 51.0;
  pdVar5[0xf] = 0.0;
  pdVar5[0x10] = (double)&DAT_402c000000000000;
  pdVar5[0x11] = 0.0;
  pdVar5[0x12] = 26.0;
  pdVar5[0x13] = 0.0;
  pdVar5[0x14] = 35.0;
  pdVar5[0x15] = 0.0;
  pdVar5[0x16] = 65.0;
  pdVar5[0x17] = 0.0;
  pdVar5[0x18] = 22.0;
  pdVar5[0x19] = 0.0;
  pdVar5[0x1a] = 34.0;
  pdVar5[0x1b] = 0.0;
  pdVar5[0x1c] = 55.0;
  pdVar5[0x1d] = 0.0;
  pdVar5[0x1e] = 85.0;
  pdVar5[0x1f] = 0.0;
  if (local_98.data_ == (AssertHelperData *)&DAT_00000004) {
    iVar11 = (internal)0x0;
    if ((((*pdVar5 == *local_90) && (!NAN(*pdVar5) && !NAN(*local_90))) &&
        (pdVar5[1] == local_90[1])) && (!NAN(pdVar5[1]) && !NAN(local_90[1]))) {
      lVar7 = 0;
      iVar11 = (internal)0x0;
      pdVar6 = local_90;
      in_R9 = pdVar5;
      do {
        lVar9 = 0x18;
        lVar10 = 0;
        while( true ) {
          if (lVar10 == 3) goto LAB_0019a1cb;
          dVar3 = *(double *)((long)in_R9 + lVar9 + -8);
          lVar10 = lVar10 + 1;
          pdVar2 = (double *)((long)pdVar6 + lVar9 + -8);
          if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) break;
          pdVar2 = (double *)((long)in_R9 + lVar9);
          pdVar1 = (double *)((long)pdVar6 + lVar9);
          lVar9 = lVar9 + 0x10;
          if ((*pdVar2 != *pdVar1) || (NAN(*pdVar2) || NAN(*pdVar1))) break;
        }
        if (lVar10 < 4) break;
LAB_0019a1cb:
        lVar7 = lVar7 + 1;
        iVar11 = (internal)(3 < lVar7);
        if (lVar7 == 4) break;
        if ((pdVar5[lVar7 * 8] != local_90[lVar7 * 8]) ||
           (NAN(pdVar5[lVar7 * 8]) || NAN(local_90[lVar7 * 8]))) break;
        in_R9 = in_R9 + 8;
        pdVar6 = pdVar6 + 8;
        if ((pdVar5[lVar7 * 8 + 1] != local_90[lVar7 * 8 + 1]) ||
           (NAN(pdVar5[lVar7 * 8 + 1]) || NAN(local_90[lVar7 * 8 + 1]))) break;
      } while( true );
    }
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8 = iVar11;
  if (iVar11 == (internal)0x0) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_a8,(AssertionResult *)"AoB == AoB_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_78.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_78.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_78.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_a8,&local_d8,(SquareMatrix<std::complex<double>_> *)local_e8);
  pdVar6 = (double *)operator_new__(0x100);
  memset(pdVar6,0,0x100);
  *pdVar6 = (double)&DAT_401c000000000000;
  pdVar6[1] = 0.0;
  pdVar6[2] = 21.0;
  pdVar6[3] = 0.0;
  pdVar6[4] = (double)&DAT_402a000000000000;
  pdVar6[5] = 0.0;
  pdVar6[6] = 39.0;
  pdVar6[7] = 0.0;
  pdVar6[8] = (double)&DAT_402c000000000000;
  pdVar6[9] = 0.0;
  pdVar6[10] = 35.0;
  pdVar6[0xb] = 0.0;
  pdVar6[0xc] = 26.0;
  pdVar6[0xd] = 0.0;
  pdVar6[0xe] = 65.0;
  pdVar6[0xf] = 0.0;
  pdVar6[0x10] = (double)&DAT_4026000000000000;
  pdVar6[0x11] = 0.0;
  pdVar6[0x12] = 33.0;
  pdVar6[0x13] = 0.0;
  pdVar6[0x14] = 17.0;
  pdVar6[0x15] = 0.0;
  pdVar6[0x16] = 51.0;
  pdVar6[0x17] = 0.0;
  pdVar6[0x18] = 22.0;
  pdVar6[0x19] = 0.0;
  pdVar6[0x1a] = 55.0;
  pdVar6[0x1b] = 0.0;
  pdVar6[0x1c] = 34.0;
  pdVar6[0x1d] = 0.0;
  pdVar6[0x1e] = 85.0;
  pdVar6[0x1f] = 0.0;
  local_78.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)0x0;
  if (CONCAT71(uStack_a7,local_a8) == 4) {
    local_78.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)0x0;
    if ((((*pdVar6 == (double)(local_a0->_M_dataplus)._M_p) &&
         (!NAN(*pdVar6) && !NAN((double)(local_a0->_M_dataplus)._M_p))) &&
        (local_78.ss_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_1_ = (internal)0x0, pdVar6[1] == (double)local_a0->_M_string_length)) &&
       (!NAN(pdVar6[1]) && !NAN((double)local_a0->_M_string_length))) {
      lVar7 = 0;
      local_78.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)0x0;
      pbVar8 = local_a0;
      in_R9 = pdVar6;
      do {
        lVar9 = 0x18;
        lVar10 = 0;
        while( true ) {
          if (lVar10 == 3) goto LAB_0019a4ed;
          dVar3 = *(double *)((long)in_R9 + lVar9 + -8);
          lVar10 = lVar10 + 1;
          pdVar2 = (double *)((long)pbVar8 + lVar9 + -8);
          if ((dVar3 != *pdVar2) || (NAN(dVar3) || NAN(*pdVar2))) break;
          pdVar2 = (double *)((long)in_R9 + lVar9);
          pdVar1 = (double *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9);
          lVar9 = lVar9 + 0x10;
          if ((*pdVar2 != *pdVar1) || (NAN(*pdVar2) || NAN(*pdVar1))) break;
        }
        if (lVar10 < 4) break;
LAB_0019a4ed:
        lVar7 = lVar7 + 1;
        local_78.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)(3 < lVar7);
        if (lVar7 == 4) break;
        if ((pdVar6[lVar7 * 8] != (double)local_a0[lVar7 * 2]._M_dataplus._M_p) ||
           (NAN(pdVar6[lVar7 * 8]) || NAN((double)local_a0[lVar7 * 2]._M_dataplus._M_p))) break;
        in_R9 = in_R9 + 8;
        pbVar8 = pbVar8 + 2;
        if ((pdVar6[lVar7 * 8 + 1] != (double)local_a0[lVar7 * 2]._M_string_length) ||
           (NAN(pdVar6[lVar7 * 8 + 1]) || NAN((double)local_a0[lVar7 * 2]._M_string_length))) break;
      } while( true );
    }
  }
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)&local_78,(AssertionResult *)"BoA == BoA_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  operator_delete__(pdVar6);
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_a0);
  }
  operator_delete__(pdVar5);
  if (local_90 != (double *)0x0) {
    operator_delete__(local_90);
  }
  if (local_d8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_d8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if (local_e0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_e0._M_head_impl);
  }
  operator_delete__(pdVar4);
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_80);
  }
  operator_delete__(__s);
  if (local_58 != (double *)0x0) {
    operator_delete__(local_58);
  }
  if (local_50.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_50.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if (local_40.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_40.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}